

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::SignalEventExpressionSyntax::setChild
          (SignalEventExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  IffEventClauseSyntax *pIVar2;
  long in_RSI;
  long in_RDI;
  Token TVar3;
  ConstTokenOrSyntax *in_stack_ffffffffffffffa8;
  ExpressionSyntax *local_50;
  ExpressionSyntax *local_30;
  not_null<slang::syntax::ExpressionSyntax_*> local_28;
  undefined8 local_20;
  Info *local_18;
  
  if (in_RSI == 0) {
    TVar3 = ConstTokenOrSyntax::token(in_stack_ffffffffffffffa8);
    local_20 = TVar3._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar3.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else if (in_RSI == 1) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x51d282);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_50 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x51d292);
      local_50 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    local_30 = local_50;
    not_null<slang::syntax::ExpressionSyntax_*>::not_null<slang::syntax::ExpressionSyntax_*>
              (&local_28,&local_30);
    *(ExpressionSyntax **)(in_RDI + 0x28) = local_28.ptr;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x51d2dd);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pIVar2 = (IffEventClauseSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x51d2ed);
      pIVar2 = SyntaxNode::as<slang::syntax::IffEventClauseSyntax>(pSVar1);
    }
    *(IffEventClauseSyntax **)(in_RDI + 0x30) = pIVar2;
  }
  return;
}

Assistant:

void SignalEventExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: edge = child.token(); return;
        case 1: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 2: iffClause = child.node() ? &child.node()->as<IffEventClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}